

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

QString * architectureFromName(QString *__return_storage_ptr__,QString *name)

{
  char cVar1;
  long in_FS_OFFSET;
  QRegularExpressionMatch match;
  QRegularExpression architecture;
  QArrayData *local_48;
  char16_t *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QArrayData *)0x0;
  local_40 = L"_(armeabi-v7a|arm64-v8a|x86|x86_64).so$";
  local_38 = 0x27;
  QRegularExpression::QRegularExpression((QRegularExpression *)&local_30,&local_48,0);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  QRegularExpression::match(&local_48,&local_30,name,0,0,0);
  cVar1 = QRegularExpressionMatch::hasMatch();
  if (cVar1 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QRegularExpressionMatch::captured((int)__return_storage_ptr__);
  }
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_48);
  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString architectureFromName(const QString &name)
{
    QRegularExpression architecture(QStringLiteral("_(armeabi-v7a|arm64-v8a|x86|x86_64).so$"));
    auto match = architecture.match(name);
    if (!match.hasMatch())
        return {};
    return match.captured(1);
}